

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ParserResult * Catch::Clara::Detail::convertInto(string *source,string *target)

{
  string *in_RDX;
  string *in_RSI;
  ParserResult *in_RDI;
  ParseResultType *in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::operator=(in_RDX,in_RSI);
  BasicResult<Catch::Clara::ParseResultType>::ok<Catch::Clara::ParseResultType>
            (in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

ParserResult convertInto( std::string const& source,
                                      std::string& target ) {
                target = source;
                return ParserResult::ok( ParseResultType::Matched );
            }